

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdevice.cpp
# Opt level: O0

bool __thiscall QPrintDevice::supportsCollateCopies(QPrintDevice *this)

{
  bool bVar1;
  int iVar2;
  QPlatformPrintDevice *pQVar3;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  byte bVar4;
  
  bVar1 = isValid((QPrintDevice *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  bVar4 = 0;
  if (bVar1) {
    pQVar3 = QSharedPointer<QPlatformPrintDevice>::operator->
                       ((QSharedPointer<QPlatformPrintDevice> *)0x1386f3);
    iVar2 = (*pQVar3->_vptr_QPlatformPrintDevice[0xc])();
    bVar4 = (byte)iVar2;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool QPrintDevice::supportsCollateCopies() const
{
    return isValid() && d->supportsCollateCopies();
}